

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::internal::utf8_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,uint8_t *ptr,size_t length)

{
  allocator<char> local_75 [20];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uint8_t *local_20;
  size_t length_local;
  uint8_t *ptr_local;
  
  local_20 = ptr;
  length_local = (size_t)this;
  ptr_local = (uint8_t *)__return_storage_ptr__;
  if (NATIVE_UTF8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,(char *)this,(size_type)ptr,&local_61);
    std::operator+(&local_40,"\'",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"\'");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(unknown encoding)",local_75);
    std::allocator<char>::~allocator(local_75);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf8_to_string(const uint8_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    return "'" + std::string(reinterpret_cast<const char *>(ptr), length) + "'";
  }
#ifdef _MSC_VER
  std::wstring tmp(length * 2U, L'\0');
  auto numChars =
      MultiByteToWideChar(CP_UTF8, 0, reinterpret_cast<const char *>(ptr), length, &tmp.front(), tmp.size());
  tmp.resize(numChars);
  std::string result(length * 2U, '\0');
  numChars = WideCharToMultiByte(CP_ACP, 0, tmp.data(), tmp.size(), &result.front(), result.size(), nullptr, nullptr);
  result.resize(numChars);
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}